

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::PrefixString(aiString *string,char *prefix,uint len)

{
  char *__src;
  ai_uint32 aVar1;
  Logger *this;
  
  aVar1 = string->length;
  if ((aVar1 == 0) || (string->data[0] != '$')) {
    if (0x3fe < aVar1 + len) {
      this = DefaultLogger::get();
      Logger::debug(this,"Can\'t add an unique prefix because the string is too long");
      return;
    }
    __src = string->data;
    memmove(__src + len,__src,(ulong)(aVar1 + 1));
    memcpy(__src,prefix,(ulong)len);
    string->length = string->length + len;
  }
  return;
}

Assistant:

inline
void PrefixString(aiString& string,const char* prefix, unsigned int len) {
    // If the string is already prefixed, we won't prefix it a second time
    if (string.length >= 1 && string.data[0] == '$')
        return;

    if (len+string.length>=MAXLEN-1) {
        ASSIMP_LOG_DEBUG("Can't add an unique prefix because the string is too long");
        ai_assert(false);
        return;
    }

    // Add the prefix
    ::memmove(string.data+len,string.data,string.length+1);
    ::memcpy (string.data, prefix, len);

    // And update the string's length
    string.length += len;
}